

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound-test.cpp
# Opt level: O2

int main(void)

{
  long lVar1;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  initializer_list<float> __l_01;
  initializer_list<float> __l_02;
  initializer_list<float> __l_03;
  initializer_list<float> __l_04;
  initializer_list<float> __l_05;
  initializer_list<float> __l_06;
  initializer_list<float> __l_07;
  initializer_list<float> __l_08;
  initializer_list<float> __l_09;
  initializer_list<float> __l_10;
  initializer_list<float> __l_11;
  initializer_list<float> __l_12;
  initializer_list<float> __l_13;
  initializer_list<float> __l_14;
  initializer_list<float> __l_15;
  initializer_list<float> __l_16;
  initializer_list<float> __l_17;
  initializer_list<float> __l_18;
  initializer_list<float> __l_19;
  initializer_list<float> __l_20;
  initializer_list<float> __l_21;
  initializer_list<float> __l_22;
  initializer_list<float> __l_23;
  initializer_list<float> __l_24;
  initializer_list<float> __l_25;
  initializer_list<float> __l_26;
  initializer_list<float> __l_27;
  initializer_list<float> __l_28;
  initializer_list<float> __l_29;
  initializer_list<float> __l_30;
  initializer_list<float> __l_31;
  initializer_list<float> __l_32;
  initializer_list<float> __l_33;
  initializer_list<float> __l_34;
  initializer_list<float> __l_35;
  initializer_list<float> __l_36;
  initializer_list<float> __l_37;
  initializer_list<float> __l_38;
  initializer_list<float> __l_39;
  initializer_list<float> __l_40;
  initializer_list<float> __l_41;
  initializer_list<float> __l_42;
  initializer_list<float> __l_43;
  initializer_list<float> __l_44;
  initializer_list<float> __l_45;
  initializer_list<float> __l_46;
  initializer_list<float> __l_47;
  initializer_list<float> __l_48;
  initializer_list<float> __l_49;
  initializer_list<float> __l_50;
  initializer_list<float> __l_51;
  initializer_list<float> __l_52;
  initializer_list<float> __l_53;
  initializer_list<float> __l_54;
  initializer_list<float> __l_55;
  initializer_list<float> __l_56;
  initializer_list<float> __l_57;
  initializer_list<float> __l_58;
  initializer_list<float> __l_59;
  initializer_list<float> __l_60;
  initializer_list<float> __l_61;
  initializer_list<float> __l_62;
  initializer_list<float> __l_63;
  initializer_list<float> __l_64;
  initializer_list<std::vector<float,_std::allocator<float>_>_> __l_65;
  allocator_type local_ac3;
  allocator_type local_ac2;
  allocator_type local_ac1;
  allocator_type local_ac0;
  allocator_type local_abf;
  allocator_type local_abe;
  allocator_type local_abd;
  allocator_type local_abc;
  allocator_type local_abb;
  allocator_type local_aba;
  allocator_type local_ab9;
  allocator_type local_ab8;
  allocator_type local_ab7;
  allocator_type local_ab6;
  allocator_type local_ab5;
  allocator_type local_ab4;
  allocator_type local_ab3;
  allocator_type local_ab2;
  allocator_type local_ab1;
  allocator_type local_ab0;
  allocator_type local_aaf;
  allocator_type local_aae;
  allocator_type local_aad;
  allocator_type local_aac;
  allocator_type local_aab;
  allocator_type local_aaa;
  allocator_type local_aa9;
  allocator_type local_aa8;
  allocator_type local_aa7;
  allocator_type local_aa6;
  allocator_type local_aa5;
  allocator_type local_aa4;
  allocator_type local_aa3;
  allocator_type local_aa2;
  allocator_type local_aa1;
  allocator_type local_aa0;
  allocator_type local_a9f;
  allocator_type local_a9e;
  allocator_type local_a9d;
  allocator_type local_a9c;
  allocator_type local_a9b;
  allocator_type local_a9a;
  allocator_type local_a99;
  allocator_type local_a98;
  allocator_type local_a97;
  allocator_type local_a96;
  allocator_type local_a95;
  allocator_type local_a94;
  allocator_type local_a93;
  allocator_type local_a92;
  allocator_type local_a91;
  allocator_type local_a90;
  allocator_type local_a8f;
  allocator_type local_a8e;
  allocator_type local_a8d;
  allocator_type local_a8c;
  allocator_type local_a8b;
  allocator_type local_a8a;
  allocator_type local_a89;
  allocator_type local_a88;
  allocator_type local_a87;
  allocator_type local_a86;
  allocator_type local_a85;
  allocator_type local_a84;
  allocator_type local_a83;
  allocator_type local_a82;
  allocator_type local_a81;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_a80;
  float local_a68 [6];
  float local_a50 [4];
  float local_a40 [4];
  float local_a30 [4];
  float local_a20 [4];
  float local_a10 [4];
  float local_a00 [4];
  float local_9f0 [4];
  float local_9e0 [4];
  float local_9d0 [4];
  float local_9c0 [4];
  float local_9b0 [4];
  float local_9a0 [4];
  float local_990 [4];
  float local_980 [4];
  float local_970 [4];
  float local_960 [4];
  float local_950 [4];
  float local_940 [4];
  float local_930 [4];
  float local_920 [4];
  float local_910 [4];
  float local_900 [4];
  float local_8f0 [4];
  float local_8e0 [4];
  float local_8d0 [4];
  float local_8c0 [4];
  float local_8b0 [4];
  float local_8a0 [4];
  float local_890 [4];
  float local_880 [4];
  float local_870 [4];
  float local_860 [4];
  float local_850 [4];
  float local_840 [4];
  float local_830 [4];
  float local_820 [4];
  float local_810 [4];
  float local_800 [4];
  float local_7f0 [4];
  float local_7e0 [4];
  float local_7d0 [4];
  float local_7c0 [4];
  float local_7b0 [4];
  float local_7a0 [4];
  float local_790 [4];
  float local_780 [4];
  float local_770 [4];
  float local_760 [4];
  float local_750 [4];
  float local_740 [4];
  float local_730 [4];
  float local_720 [4];
  float local_710 [4];
  float local_700 [4];
  float local_6f0 [4];
  float local_6e0 [4];
  float local_6d0 [4];
  float local_6c0 [4];
  float local_6b0 [4];
  float local_6a0 [4];
  float local_690 [4];
  float local_680 [4];
  float local_670 [4];
  float local_660 [4];
  undefined1 local_650 [48];
  vector<float,_std::allocator<float>_> local_620;
  vector<float,_std::allocator<float>_> local_608;
  vector<float,_std::allocator<float>_> local_5f0;
  vector<float,_std::allocator<float>_> local_5d8;
  vector<float,_std::allocator<float>_> local_5c0;
  vector<float,_std::allocator<float>_> local_5a8;
  vector<float,_std::allocator<float>_> local_590;
  vector<float,_std::allocator<float>_> local_578;
  vector<float,_std::allocator<float>_> local_560;
  vector<float,_std::allocator<float>_> local_548;
  vector<float,_std::allocator<float>_> local_530;
  vector<float,_std::allocator<float>_> local_518;
  vector<float,_std::allocator<float>_> local_500;
  vector<float,_std::allocator<float>_> local_4e8;
  vector<float,_std::allocator<float>_> local_4d0;
  vector<float,_std::allocator<float>_> local_4b8;
  vector<float,_std::allocator<float>_> local_4a0;
  vector<float,_std::allocator<float>_> local_488;
  vector<float,_std::allocator<float>_> local_470;
  vector<float,_std::allocator<float>_> local_458;
  vector<float,_std::allocator<float>_> local_440;
  vector<float,_std::allocator<float>_> local_428;
  vector<float,_std::allocator<float>_> local_410;
  vector<float,_std::allocator<float>_> local_3f8;
  vector<float,_std::allocator<float>_> local_3e0;
  vector<float,_std::allocator<float>_> local_3c8;
  vector<float,_std::allocator<float>_> local_3b0;
  vector<float,_std::allocator<float>_> local_398;
  vector<float,_std::allocator<float>_> local_380;
  vector<float,_std::allocator<float>_> local_368;
  vector<float,_std::allocator<float>_> local_350;
  vector<float,_std::allocator<float>_> local_338;
  vector<float,_std::allocator<float>_> local_320;
  vector<float,_std::allocator<float>_> local_308;
  vector<float,_std::allocator<float>_> local_2f0;
  vector<float,_std::allocator<float>_> local_2d8;
  vector<float,_std::allocator<float>_> local_2c0;
  vector<float,_std::allocator<float>_> local_2a8;
  vector<float,_std::allocator<float>_> local_290;
  vector<float,_std::allocator<float>_> local_278;
  vector<float,_std::allocator<float>_> local_260;
  vector<float,_std::allocator<float>_> local_248;
  vector<float,_std::allocator<float>_> local_230;
  vector<float,_std::allocator<float>_> local_218;
  vector<float,_std::allocator<float>_> local_200;
  vector<float,_std::allocator<float>_> local_1e8;
  vector<float,_std::allocator<float>_> local_1d0;
  vector<float,_std::allocator<float>_> local_1b8;
  vector<float,_std::allocator<float>_> local_1a0;
  vector<float,_std::allocator<float>_> local_188;
  vector<float,_std::allocator<float>_> local_170;
  vector<float,_std::allocator<float>_> local_158;
  vector<float,_std::allocator<float>_> local_140;
  vector<float,_std::allocator<float>_> local_128;
  vector<float,_std::allocator<float>_> local_110;
  vector<float,_std::allocator<float>_> local_f8;
  vector<float,_std::allocator<float>_> local_e0;
  vector<float,_std::allocator<float>_> local_c8;
  vector<float,_std::allocator<float>_> local_b0;
  vector<float,_std::allocator<float>_> local_98;
  vector<float,_std::allocator<float>_> local_80;
  vector<float,_std::allocator<float>_> local_68;
  vector<float,_std::allocator<float>_> local_50;
  vector<float,_std::allocator<float>_> local_38;
  
  std::__cxx11::string::string((string *)local_650,"Hello, I am Robot!",(allocator *)&local_a80);
  ev3dev::sound::speak((string *)local_650,true);
  std::__cxx11::string::~string((string *)local_650);
  local_660[0] = 392.0;
  local_660[1] = 350.0;
  local_660[2] = 100.0;
  __l._M_len = 3;
  __l._M_array = local_660;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_650,__l,&local_a81);
  local_670[0] = 392.0;
  local_670[1] = 350.0;
  local_670[2] = 100.0;
  __l_00._M_len = 3;
  __l_00._M_array = local_670;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)(local_650 + 0x18),__l_00,&local_a82);
  local_680[0] = 392.0;
  local_680[1] = 350.0;
  local_680[2] = 100.0;
  __l_01._M_len = 3;
  __l_01._M_array = local_680;
  std::vector<float,_std::allocator<float>_>::vector(&local_620,__l_01,&local_a83);
  local_690[0] = 311.1;
  local_690[1] = 250.0;
  local_690[2] = 100.0;
  __l_02._M_len = 3;
  __l_02._M_array = local_690;
  std::vector<float,_std::allocator<float>_>::vector(&local_608,__l_02,&local_a84);
  local_6a0[0] = 466.2;
  local_6a0[1] = 25.0;
  local_6a0[2] = 100.0;
  __l_03._M_len = 3;
  __l_03._M_array = local_6a0;
  std::vector<float,_std::allocator<float>_>::vector(&local_5f0,__l_03,&local_a85);
  local_6b0[0] = 392.0;
  local_6b0[1] = 350.0;
  local_6b0[2] = 100.0;
  __l_04._M_len = 3;
  __l_04._M_array = local_6b0;
  std::vector<float,_std::allocator<float>_>::vector(&local_5d8,__l_04,&local_a86);
  local_6c0[0] = 311.1;
  local_6c0[1] = 250.0;
  local_6c0[2] = 100.0;
  __l_05._M_len = 3;
  __l_05._M_array = local_6c0;
  std::vector<float,_std::allocator<float>_>::vector(&local_5c0,__l_05,&local_a87);
  local_6d0[0] = 466.2;
  local_6d0[1] = 25.0;
  local_6d0[2] = 100.0;
  __l_06._M_len = 3;
  __l_06._M_array = local_6d0;
  std::vector<float,_std::allocator<float>_>::vector(&local_5a8,__l_06,&local_a88);
  local_6e0[0] = 392.0;
  local_6e0[1] = 700.0;
  local_6e0[2] = 100.0;
  __l_07._M_len = 3;
  __l_07._M_array = local_6e0;
  std::vector<float,_std::allocator<float>_>::vector(&local_590,__l_07,&local_a89);
  local_6f0[0] = 587.32;
  local_6f0[1] = 350.0;
  local_6f0[2] = 100.0;
  __l_08._M_len = 3;
  __l_08._M_array = local_6f0;
  std::vector<float,_std::allocator<float>_>::vector(&local_578,__l_08,&local_a8a);
  local_700[0] = 587.32;
  local_700[1] = 350.0;
  local_700[2] = 100.0;
  __l_09._M_len = 3;
  __l_09._M_array = local_700;
  std::vector<float,_std::allocator<float>_>::vector(&local_560,__l_09,&local_a8b);
  local_710[0] = 587.32;
  local_710[1] = 350.0;
  local_710[2] = 100.0;
  __l_10._M_len = 3;
  __l_10._M_array = local_710;
  std::vector<float,_std::allocator<float>_>::vector(&local_548,__l_10,&local_a8c);
  local_720[0] = 622.26;
  local_720[1] = 250.0;
  local_720[2] = 100.0;
  __l_11._M_len = 3;
  __l_11._M_array = local_720;
  std::vector<float,_std::allocator<float>_>::vector(&local_530,__l_11,&local_a8d);
  local_730[0] = 466.2;
  local_730[1] = 25.0;
  local_730[2] = 100.0;
  __l_12._M_len = 3;
  __l_12._M_array = local_730;
  std::vector<float,_std::allocator<float>_>::vector(&local_518,__l_12,&local_a8e);
  local_740[0] = 369.99;
  local_740[1] = 350.0;
  local_740[2] = 100.0;
  __l_13._M_len = 3;
  __l_13._M_array = local_740;
  std::vector<float,_std::allocator<float>_>::vector(&local_500,__l_13,&local_a8f);
  local_750[0] = 311.1;
  local_750[1] = 250.0;
  local_750[2] = 100.0;
  __l_14._M_len = 3;
  __l_14._M_array = local_750;
  std::vector<float,_std::allocator<float>_>::vector(&local_4e8,__l_14,&local_a90);
  local_760[0] = 466.2;
  local_760[1] = 25.0;
  local_760[2] = 100.0;
  __l_15._M_len = 3;
  __l_15._M_array = local_760;
  std::vector<float,_std::allocator<float>_>::vector(&local_4d0,__l_15,&local_a91);
  local_770[0] = 392.0;
  local_770[1] = 700.0;
  local_770[2] = 100.0;
  __l_16._M_len = 3;
  __l_16._M_array = local_770;
  std::vector<float,_std::allocator<float>_>::vector(&local_4b8,__l_16,&local_a92);
  local_780[0] = 784.0;
  local_780[1] = 350.0;
  local_780[2] = 100.0;
  __l_17._M_len = 3;
  __l_17._M_array = local_780;
  std::vector<float,_std::allocator<float>_>::vector(&local_4a0,__l_17,&local_a93);
  local_790[0] = 392.0;
  local_790[1] = 250.0;
  local_790[2] = 100.0;
  __l_18._M_len = 3;
  __l_18._M_array = local_790;
  std::vector<float,_std::allocator<float>_>::vector(&local_488,__l_18,&local_a94);
  local_7a0[0] = 392.0;
  local_7a0[1] = 25.0;
  local_7a0[2] = 100.0;
  __l_19._M_len = 3;
  __l_19._M_array = local_7a0;
  std::vector<float,_std::allocator<float>_>::vector(&local_470,__l_19,&local_a95);
  local_7b0[0] = 784.0;
  local_7b0[1] = 350.0;
  local_7b0[2] = 100.0;
  __l_20._M_len = 3;
  __l_20._M_array = local_7b0;
  std::vector<float,_std::allocator<float>_>::vector(&local_458,__l_20,&local_a96);
  local_7c0[0] = 739.98;
  local_7c0[1] = 250.0;
  local_7c0[2] = 100.0;
  __l_21._M_len = 3;
  __l_21._M_array = local_7c0;
  std::vector<float,_std::allocator<float>_>::vector(&local_440,__l_21,&local_a97);
  local_7d0[0] = 698.46;
  local_7d0[1] = 25.0;
  local_7d0[2] = 100.0;
  __l_22._M_len = 3;
  __l_22._M_array = local_7d0;
  std::vector<float,_std::allocator<float>_>::vector(&local_428,__l_22,&local_a98);
  local_7e0[0] = 659.26;
  local_7e0[1] = 25.0;
  local_7e0[2] = 100.0;
  __l_23._M_len = 3;
  __l_23._M_array = local_7e0;
  std::vector<float,_std::allocator<float>_>::vector(&local_410,__l_23,&local_a99);
  local_7f0[0] = 622.26;
  local_7f0[1] = 25.0;
  local_7f0[2] = 100.0;
  __l_24._M_len = 3;
  __l_24._M_array = local_7f0;
  std::vector<float,_std::allocator<float>_>::vector(&local_3f8,__l_24,&local_a9a);
  local_800[0] = 659.26;
  local_800[1] = 50.0;
  local_800[2] = 400.0;
  __l_25._M_len = 3;
  __l_25._M_array = local_800;
  std::vector<float,_std::allocator<float>_>::vector(&local_3e0,__l_25,&local_a9b);
  local_810[0] = 415.3;
  local_810[1] = 25.0;
  local_810[2] = 200.0;
  __l_26._M_len = 3;
  __l_26._M_array = local_810;
  std::vector<float,_std::allocator<float>_>::vector(&local_3c8,__l_26,&local_a9c);
  local_820[0] = 554.36;
  local_820[1] = 350.0;
  local_820[2] = 100.0;
  __l_27._M_len = 3;
  __l_27._M_array = local_820;
  std::vector<float,_std::allocator<float>_>::vector(&local_3b0,__l_27,&local_a9d);
  local_830[0] = 523.25;
  local_830[1] = 250.0;
  local_830[2] = 100.0;
  __l_28._M_len = 3;
  __l_28._M_array = local_830;
  std::vector<float,_std::allocator<float>_>::vector(&local_398,__l_28,&local_a9e);
  local_840[0] = 493.88;
  local_840[1] = 25.0;
  local_840[2] = 100.0;
  __l_29._M_len = 3;
  __l_29._M_array = local_840;
  std::vector<float,_std::allocator<float>_>::vector(&local_380,__l_29,&local_a9f);
  local_850[0] = 466.16;
  local_850[1] = 25.0;
  local_850[2] = 100.0;
  __l_30._M_len = 3;
  __l_30._M_array = local_850;
  std::vector<float,_std::allocator<float>_>::vector(&local_368,__l_30,&local_aa0);
  local_860[0] = 440.0;
  local_860[1] = 25.0;
  local_860[2] = 100.0;
  __l_31._M_len = 3;
  __l_31._M_array = local_860;
  std::vector<float,_std::allocator<float>_>::vector(&local_350,__l_31,&local_aa1);
  local_870[0] = 466.16;
  local_870[1] = 50.0;
  local_870[2] = 400.0;
  __l_32._M_len = 3;
  __l_32._M_array = local_870;
  std::vector<float,_std::allocator<float>_>::vector(&local_338,__l_32,&local_aa2);
  local_880[0] = 311.13;
  local_880[1] = 25.0;
  local_880[2] = 200.0;
  __l_33._M_len = 3;
  __l_33._M_array = local_880;
  std::vector<float,_std::allocator<float>_>::vector(&local_320,__l_33,&local_aa3);
  local_890[0] = 369.99;
  local_890[1] = 350.0;
  local_890[2] = 100.0;
  __l_34._M_len = 3;
  __l_34._M_array = local_890;
  std::vector<float,_std::allocator<float>_>::vector(&local_308,__l_34,&local_aa4);
  local_8a0[0] = 311.13;
  local_8a0[1] = 250.0;
  local_8a0[2] = 100.0;
  __l_35._M_len = 3;
  __l_35._M_array = local_8a0;
  std::vector<float,_std::allocator<float>_>::vector(&local_2f0,__l_35,&local_aa5);
  local_8b0[0] = 392.0;
  local_8b0[1] = 25.0;
  local_8b0[2] = 100.0;
  __l_36._M_len = 3;
  __l_36._M_array = local_8b0;
  std::vector<float,_std::allocator<float>_>::vector(&local_2d8,__l_36,&local_aa6);
  local_8c0[0] = 466.16;
  local_8c0[1] = 350.0;
  local_8c0[2] = 100.0;
  __l_37._M_len = 3;
  __l_37._M_array = local_8c0;
  std::vector<float,_std::allocator<float>_>::vector(&local_2c0,__l_37,&local_aa7);
  local_8d0[0] = 392.0;
  local_8d0[1] = 250.0;
  local_8d0[2] = 100.0;
  __l_38._M_len = 3;
  __l_38._M_array = local_8d0;
  std::vector<float,_std::allocator<float>_>::vector(&local_2a8,__l_38,&local_aa8);
  local_8e0[0] = 466.16;
  local_8e0[1] = 25.0;
  local_8e0[2] = 100.0;
  __l_39._M_len = 3;
  __l_39._M_array = local_8e0;
  std::vector<float,_std::allocator<float>_>::vector(&local_290,__l_39,&local_aa9);
  local_8f0[0] = 587.32;
  local_8f0[1] = 700.0;
  local_8f0[2] = 100.0;
  __l_40._M_len = 3;
  __l_40._M_array = local_8f0;
  std::vector<float,_std::allocator<float>_>::vector(&local_278,__l_40,&local_aaa);
  local_900[0] = 784.0;
  local_900[1] = 350.0;
  local_900[2] = 100.0;
  __l_41._M_len = 3;
  __l_41._M_array = local_900;
  std::vector<float,_std::allocator<float>_>::vector(&local_260,__l_41,&local_aab);
  local_910[0] = 392.0;
  local_910[1] = 250.0;
  local_910[2] = 100.0;
  __l_42._M_len = 3;
  __l_42._M_array = local_910;
  std::vector<float,_std::allocator<float>_>::vector(&local_248,__l_42,&local_aac);
  local_920[0] = 392.0;
  local_920[1] = 25.0;
  local_920[2] = 100.0;
  __l_43._M_len = 3;
  __l_43._M_array = local_920;
  std::vector<float,_std::allocator<float>_>::vector(&local_230,__l_43,&local_aad);
  local_930[0] = 784.0;
  local_930[1] = 350.0;
  local_930[2] = 100.0;
  __l_44._M_len = 3;
  __l_44._M_array = local_930;
  std::vector<float,_std::allocator<float>_>::vector(&local_218,__l_44,&local_aae);
  local_940[0] = 739.98;
  local_940[1] = 250.0;
  local_940[2] = 100.0;
  __l_45._M_len = 3;
  __l_45._M_array = local_940;
  std::vector<float,_std::allocator<float>_>::vector(&local_200,__l_45,&local_aaf);
  local_950[0] = 698.46;
  local_950[1] = 25.0;
  local_950[2] = 100.0;
  __l_46._M_len = 3;
  __l_46._M_array = local_950;
  std::vector<float,_std::allocator<float>_>::vector(&local_1e8,__l_46,&local_ab0);
  local_960[0] = 659.26;
  local_960[1] = 25.0;
  local_960[2] = 100.0;
  __l_47._M_len = 3;
  __l_47._M_array = local_960;
  std::vector<float,_std::allocator<float>_>::vector(&local_1d0,__l_47,&local_ab1);
  local_970[0] = 622.26;
  local_970[1] = 25.0;
  local_970[2] = 100.0;
  __l_48._M_len = 3;
  __l_48._M_array = local_970;
  std::vector<float,_std::allocator<float>_>::vector(&local_1b8,__l_48,&local_ab2);
  local_980[0] = 659.26;
  local_980[1] = 50.0;
  local_980[2] = 400.0;
  __l_49._M_len = 3;
  __l_49._M_array = local_980;
  std::vector<float,_std::allocator<float>_>::vector(&local_1a0,__l_49,&local_ab3);
  local_990[0] = 415.3;
  local_990[1] = 25.0;
  local_990[2] = 200.0;
  __l_50._M_len = 3;
  __l_50._M_array = local_990;
  std::vector<float,_std::allocator<float>_>::vector(&local_188,__l_50,&local_ab4);
  local_9a0[0] = 554.36;
  local_9a0[1] = 350.0;
  local_9a0[2] = 100.0;
  __l_51._M_len = 3;
  __l_51._M_array = local_9a0;
  std::vector<float,_std::allocator<float>_>::vector(&local_170,__l_51,&local_ab5);
  local_9b0[0] = 523.25;
  local_9b0[1] = 250.0;
  local_9b0[2] = 100.0;
  __l_52._M_len = 3;
  __l_52._M_array = local_9b0;
  std::vector<float,_std::allocator<float>_>::vector(&local_158,__l_52,&local_ab6);
  local_9c0[0] = 493.88;
  local_9c0[1] = 25.0;
  local_9c0[2] = 100.0;
  __l_53._M_len = 3;
  __l_53._M_array = local_9c0;
  std::vector<float,_std::allocator<float>_>::vector(&local_140,__l_53,&local_ab7);
  local_9d0[0] = 466.16;
  local_9d0[1] = 25.0;
  local_9d0[2] = 100.0;
  __l_54._M_len = 3;
  __l_54._M_array = local_9d0;
  std::vector<float,_std::allocator<float>_>::vector(&local_128,__l_54,&local_ab8);
  local_9e0[0] = 440.0;
  local_9e0[1] = 25.0;
  local_9e0[2] = 100.0;
  __l_55._M_len = 3;
  __l_55._M_array = local_9e0;
  std::vector<float,_std::allocator<float>_>::vector(&local_110,__l_55,&local_ab9);
  local_9f0[0] = 466.16;
  local_9f0[1] = 50.0;
  local_9f0[2] = 400.0;
  __l_56._M_len = 3;
  __l_56._M_array = local_9f0;
  std::vector<float,_std::allocator<float>_>::vector(&local_f8,__l_56,&local_aba);
  local_a00[0] = 311.13;
  local_a00[1] = 25.0;
  local_a00[2] = 200.0;
  __l_57._M_len = 3;
  __l_57._M_array = local_a00;
  std::vector<float,_std::allocator<float>_>::vector(&local_e0,__l_57,&local_abb);
  local_a10[0] = 392.0;
  local_a10[1] = 350.0;
  local_a10[2] = 100.0;
  __l_58._M_len = 3;
  __l_58._M_array = local_a10;
  std::vector<float,_std::allocator<float>_>::vector(&local_c8,__l_58,&local_abc);
  local_a20[0] = 311.13;
  local_a20[1] = 250.0;
  local_a20[2] = 100.0;
  __l_59._M_len = 3;
  __l_59._M_array = local_a20;
  std::vector<float,_std::allocator<float>_>::vector(&local_b0,__l_59,&local_abd);
  local_a30[0] = 466.16;
  local_a30[1] = 25.0;
  local_a30[2] = 100.0;
  __l_60._M_len = 3;
  __l_60._M_array = local_a30;
  std::vector<float,_std::allocator<float>_>::vector(&local_98,__l_60,&local_abe);
  local_a40[0] = 392.0;
  local_a40[1] = 300.0;
  local_a40[2] = 150.0;
  __l_61._M_len = 3;
  __l_61._M_array = local_a40;
  std::vector<float,_std::allocator<float>_>::vector(&local_80,__l_61,&local_abf);
  local_a50[0] = 311.13;
  local_a50[1] = 250.0;
  local_a50[2] = 100.0;
  __l_62._M_len = 3;
  __l_62._M_array = local_a50;
  std::vector<float,_std::allocator<float>_>::vector(&local_68,__l_62,&local_ac0);
  local_a68[2] = 466.16;
  local_a68[3] = 25.0;
  local_a68[4] = 100.0;
  __l_63._M_len = 3;
  __l_63._M_array = local_a68 + 2;
  std::vector<float,_std::allocator<float>_>::vector(&local_50,__l_63,&local_ac1);
  local_a68[0] = 392.0;
  local_a68[1] = 700.0;
  __l_64._M_len = 2;
  __l_64._M_array = local_a68;
  std::vector<float,_std::allocator<float>_>::vector(&local_38,__l_64,&local_ac2);
  __l_65._M_len = 0x42;
  __l_65._M_array = (iterator)local_650;
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(&local_a80,__l_65,&local_ac3);
  ev3dev::sound::tone(&local_a80,true);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_a80);
  lVar1 = 0x618;
  do {
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)(local_650 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return 0;
}

Assistant:

int main() {
    sound::speak("Hello, I am Robot!", true);
    sound::tone({
            {392, 350, 100}, {392, 350, 100}, {392, 350, 100}, {311.1, 250, 100},
            {466.2, 25, 100}, {392, 350, 100}, {311.1, 250, 100}, {466.2, 25, 100},
            {392, 700, 100}, {587.32, 350, 100}, {587.32, 350, 100},
            {587.32, 350, 100}, {622.26, 250, 100}, {466.2, 25, 100},
            {369.99, 350, 100}, {311.1, 250, 100}, {466.2, 25, 100}, {392, 700, 100},
            {784, 350, 100}, {392, 250, 100}, {392, 25, 100}, {784, 350, 100},
            {739.98, 250, 100}, {698.46, 25, 100}, {659.26, 25, 100},
            {622.26, 25, 100}, {659.26, 50, 400}, {415.3, 25, 200}, {554.36, 350, 100},
            {523.25, 250, 100}, {493.88, 25, 100}, {466.16, 25, 100}, {440, 25, 100},
            {466.16, 50, 400}, {311.13, 25, 200}, {369.99, 350, 100},
            {311.13, 250, 100}, {392, 25, 100}, {466.16, 350, 100}, {392, 250, 100},
            {466.16, 25, 100}, {587.32, 700, 100}, {784, 350, 100}, {392, 250, 100},
            {392, 25, 100}, {784, 350, 100}, {739.98, 250, 100}, {698.46, 25, 100},
            {659.26, 25, 100}, {622.26, 25, 100}, {659.26, 50, 400}, {415.3, 25, 200},
            {554.36, 350, 100}, {523.25, 250, 100}, {493.88, 25, 100},
            {466.16, 25, 100}, {440, 25, 100}, {466.16, 50, 400}, {311.13, 25, 200},
            {392, 350, 100}, {311.13, 250, 100}, {466.16, 25, 100},
            {392.00, 300, 150}, {311.13, 250, 100}, {466.16, 25, 100}, {392, 700}
            },
            true
            );
}